

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool __thiscall ON_RTree::CreateMeshFaceTree(ON_RTree *this,ON_Mesh *mesh)

{
  int iVar1;
  int iVar2;
  Blk *pBVar3;
  ON_MeshFace *pOVar4;
  ON_3fPoint *pOVar5;
  bool bVar6;
  ON_3dPointArray *pOVar7;
  double *pdVar8;
  ON_3dPoint *pOVar9;
  Blk *pBVar10;
  int *piVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  ON_3dPoint V;
  double fmin [3];
  double fmax [3];
  ON_3dPoint local_b8;
  double local_a0;
  undefined8 local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78 [2];
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined8 local_48;
  double local_40;
  ulong local_38;
  
  this->m_root = (ON_RTreeNode *)0x0;
  pBVar10 = (this->m_mem_pool).m_blk_list;
  if (pBVar10 != (Blk *)0x0) {
    (this->m_mem_pool).m_blk_list = (Blk *)0x0;
    (this->m_mem_pool).m_sizeof_blk = 0;
    (this->m_mem_pool).m_buffer = (uchar *)0x0;
    (this->m_mem_pool).m_buffer_capacity = 0;
    (this->m_mem_pool).m_nodes = (Blk *)0x0;
    (this->m_mem_pool).m_list_nodes = (Blk *)0x0;
    (this->m_mem_pool).m_sizeof_heap = 0;
    do {
      pBVar3 = pBVar10->m_next;
      onfree(pBVar10);
      pBVar10 = pBVar3;
    } while (pBVar3 != (Blk *)0x0);
  }
  if (((mesh == (ON_Mesh *)0x0) || (iVar1 = (mesh->m_F).m_count, iVar1 == 0)) ||
     (pOVar4 = (mesh->m_F).m_a, pOVar4 == (ON_MeshFace *)0x0)) {
LAB_005af582:
    bVar6 = false;
  }
  else {
    pOVar5 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
    bVar6 = ON_Mesh::HasDoublePrecisionVertices(mesh);
    if (bVar6) {
      pOVar7 = ON_Mesh::DoublePrecisionVertices(mesh);
      pOVar9 = (pOVar7->super_ON_SimpleArray<ON_3dPoint>).m_a;
    }
    else {
      pOVar9 = (ON_3dPoint *)0x0;
    }
    if (pOVar5 == (ON_3fPoint *)0x0) {
      if (pOVar9 == (ON_3dPoint *)0x0) goto LAB_005af582;
      piVar11 = pOVar4->vi + 3;
      uVar12 = 0;
      do {
        local_68 = pOVar9[((ON_MeshFace *)(piVar11 + -3))->vi[0]].x;
        dVar18 = pOVar9[((ON_MeshFace *)(piVar11 + -3))->vi[0]].y;
        dVar16 = pOVar9[((ON_MeshFace *)(piVar11 + -3))->vi[0]].z;
        uVar13 = SUB84(dVar16,0);
        uVar14 = (undefined4)((ulong)dVar16 >> 0x20);
        dVar17 = pOVar9[piVar11[-2]].z;
        dVar15 = pOVar9[piVar11[-2]].x;
        dVar24 = pOVar9[piVar11[-2]].y;
        if (local_68 <= dVar15) {
          uVar19 = SUB84(local_68,0);
          uVar21 = (undefined4)((ulong)local_68 >> 0x20);
          local_88 = local_68;
          if (local_68 < dVar15) {
            local_68 = dVar15;
          }
        }
        else {
          uVar19 = SUB84(dVar15,0);
          uVar21 = (undefined4)((ulong)dVar15 >> 0x20);
          local_88 = dVar15;
        }
        dVar15 = local_68;
        local_80 = dVar18;
        local_78[0] = dVar16;
        local_60 = dVar18;
        local_58 = dVar16;
        if (dVar18 <= dVar24) {
          uVar20 = SUB84(dVar24,0);
          uVar22 = (undefined4)((ulong)dVar24 >> 0x20);
          pdVar8 = &local_60;
          dVar23 = dVar18;
          if (dVar18 < dVar24) goto LAB_005af019;
        }
        else {
          uVar20 = SUB84(dVar18,0);
          uVar22 = (undefined4)((ulong)dVar18 >> 0x20);
          pdVar8 = &local_80;
          dVar18 = dVar24;
LAB_005af019:
          *pdVar8 = dVar24;
          dVar23 = (double)CONCAT44(uVar22,uVar20);
        }
        if (dVar16 <= dVar17) {
          pdVar8 = &local_58;
          dVar24 = dVar17;
          if (dVar16 < dVar17) goto LAB_005af04f;
        }
        else {
          pdVar8 = local_78;
          uVar13 = SUB84(dVar17,0);
          uVar14 = (int)((ulong)dVar17 >> 0x20);
          dVar24 = dVar16;
LAB_005af04f:
          dVar16 = dVar24;
          *pdVar8 = dVar17;
        }
        local_b8.x = pOVar9[piVar11[-1]].x;
        local_b8.y = pOVar9[piVar11[-1]].y;
        local_b8.z = pOVar9[piVar11[-1]].z;
        uVar20 = SUB84(local_b8.x,0);
        uVar22 = (undefined4)((ulong)local_b8.x >> 0x20);
        dVar17 = local_b8.x;
        if (((double)CONCAT44(uVar21,uVar19) < local_b8.x ||
             (double)CONCAT44(uVar21,uVar19) == local_b8.x) &&
           (uVar20 = uVar19, uVar22 = uVar21, dVar17 = local_88, dVar15 < local_b8.x)) {
          dVar15 = local_b8.x;
          local_68 = local_b8.x;
        }
        local_88 = dVar17;
        if (dVar18 <= local_b8.y) {
          pdVar8 = &local_60;
          dVar17 = local_b8.y;
          if (dVar23 < local_b8.y) goto LAB_005af0c1;
        }
        else {
          pdVar8 = &local_80;
          dVar18 = local_b8.y;
          dVar17 = dVar23;
LAB_005af0c1:
          dVar23 = dVar17;
          *pdVar8 = local_b8.y;
        }
        if ((double)CONCAT44(uVar14,uVar13) < local_b8.z ||
            (double)CONCAT44(uVar14,uVar13) == local_b8.z) {
          pdVar8 = &local_58;
          dVar17 = local_b8.z;
          if (dVar16 < local_b8.z) goto LAB_005af0f3;
        }
        else {
          pdVar8 = local_78;
          uVar13 = SUB84(local_b8.z,0);
          uVar14 = (int)((ulong)local_b8.z >> 0x20);
          dVar17 = dVar16;
LAB_005af0f3:
          dVar16 = dVar17;
          *pdVar8 = local_b8.z;
        }
        iVar2 = *piVar11;
        if (piVar11[-1] != iVar2) {
          local_b8.x = pOVar9[iVar2].x;
          local_b8.y = pOVar9[iVar2].y;
          local_b8.z = pOVar9[iVar2].z;
          dVar17 = local_b8.x;
          if (((double)CONCAT44(uVar22,uVar20) < local_b8.x ||
               (double)CONCAT44(uVar22,uVar20) == local_b8.x) &&
             (dVar17 = local_88, dVar15 < local_b8.x)) {
            local_68 = local_b8.x;
          }
          local_88 = dVar17;
          pdVar8 = &local_80;
          if ((local_b8.y < dVar18) || (pdVar8 = &local_60, dVar23 < local_b8.y)) {
            *pdVar8 = local_b8.y;
          }
          pdVar8 = local_78;
          if ((local_b8.z <= (double)CONCAT44(uVar14,uVar13) &&
               (double)CONCAT44(uVar14,uVar13) != local_b8.z) ||
             (pdVar8 = &local_58, dVar16 < local_b8.z)) {
            *pdVar8 = local_b8.z;
          }
        }
        bVar6 = Insert(this,&local_88,&local_68,(int)uVar12);
        if (!bVar6) {
          this->m_root = (ON_RTreeNode *)0x0;
          pBVar10 = (this->m_mem_pool).m_blk_list;
          if (pBVar10 != (Blk *)0x0) {
            (this->m_mem_pool).m_blk_list = (Blk *)0x0;
            (this->m_mem_pool).m_sizeof_blk = 0;
            (this->m_mem_pool).m_buffer = (uchar *)0x0;
            (this->m_mem_pool).m_buffer_capacity = 0;
            (this->m_mem_pool).m_nodes = (Blk *)0x0;
            (this->m_mem_pool).m_list_nodes = (Blk *)0x0;
            (this->m_mem_pool).m_sizeof_heap = 0;
            do {
              pBVar3 = pBVar10->m_next;
              onfree(pBVar10);
              pBVar10 = pBVar3;
            } while (pBVar3 != (Blk *)0x0);
            return false;
          }
          goto LAB_005af582;
        }
        uVar12 = uVar12 + 1;
        piVar11 = piVar11 + 4;
      } while (iVar1 + (uint)(iVar1 == 0) != uVar12);
    }
    else {
      local_38 = (ulong)(iVar1 + (uint)(iVar1 == 0));
      piVar11 = pOVar4->vi + 3;
      uVar12 = 0;
      if (pOVar9 == (ON_3dPoint *)0x0) {
        do {
          ON_3dPoint::operator=(&local_b8,pOVar5 + ((ON_MeshFace *)(piVar11 + -3))->vi[0]);
          local_40 = local_b8.x;
          local_68 = local_b8.x;
          local_88 = local_b8.x;
          local_60 = local_b8.y;
          local_50 = local_b8.y;
          local_80 = local_b8.y;
          local_58 = local_b8.z;
          local_98 = local_b8.z;
          local_78[0] = local_b8.z;
          ON_3dPoint::operator=(&local_b8,pOVar5 + piVar11[-2]);
          dVar16 = local_98;
          if (local_40 <= local_b8.x) {
            if (local_b8.x <= local_40) {
              local_48 = local_40;
            }
            else {
              local_68 = local_b8.x;
              local_48 = local_40;
              local_40 = local_b8.x;
            }
          }
          else {
            local_88 = local_b8.x;
            local_48 = local_b8.x;
          }
          uVar13 = SUB84(local_50,0);
          uVar14 = (undefined4)((ulong)local_50 >> 0x20);
          if (local_50 <= local_b8.y) {
            pdVar8 = &local_60;
            dVar17 = local_b8.y;
            local_a0 = local_50;
            if (local_50 < local_b8.y) goto LAB_005af298;
          }
          else {
            pdVar8 = &local_80;
            uVar13 = SUB84(local_b8.y,0);
            uVar14 = (undefined4)((ulong)local_b8.y >> 0x20);
            dVar17 = local_50;
LAB_005af298:
            *pdVar8 = local_b8.y;
            local_a0 = dVar17;
          }
          local_50 = (double)CONCAT44(uVar14,uVar13);
          if (local_98 <= local_b8.z) {
            pdVar8 = &local_58;
            dVar16 = local_b8.z;
            local_90 = local_98;
            if (local_98 < local_b8.z) goto LAB_005af2d8;
          }
          else {
            pdVar8 = local_78;
            local_98 = local_b8.z;
LAB_005af2d8:
            *pdVar8 = local_b8.z;
            local_90 = dVar16;
          }
          ON_3dPoint::operator=(&local_b8,pOVar5 + piVar11[-1]);
          uVar13 = (undefined4)((ulong)local_50 >> 0x20);
          if (local_48 <= local_b8.x) {
            if (local_40 < local_b8.x) {
              local_68 = local_b8.x;
              local_40 = local_b8.x;
            }
          }
          else {
            local_88 = local_b8.x;
            local_48 = local_b8.x;
          }
          uVar14 = SUB84(local_50,0);
          if (local_50 <= local_b8.y) {
            pdVar8 = &local_60;
            dVar16 = local_b8.y;
            dVar17 = local_a0;
            if (local_a0 < local_b8.y) goto LAB_005af381;
          }
          else {
            pdVar8 = &local_80;
            uVar14 = SUB84(local_b8.y,0);
            uVar13 = (undefined4)((ulong)local_b8.y >> 0x20);
            dVar16 = local_a0;
LAB_005af381:
            *pdVar8 = local_b8.y;
            dVar17 = dVar16;
          }
          if (local_98 <= local_b8.z) {
            pdVar8 = &local_58;
            dVar16 = local_b8.z;
            dVar18 = local_98;
            dVar15 = local_90;
            if (local_90 < local_b8.z) goto LAB_005af3b3;
          }
          else {
            pdVar8 = local_78;
            dVar16 = local_90;
            dVar18 = local_b8.z;
LAB_005af3b3:
            *pdVar8 = local_b8.z;
            dVar15 = dVar16;
          }
          if (piVar11[-1] != *piVar11) {
            local_50 = (double)CONCAT44(uVar13,uVar14);
            local_a0 = dVar17;
            local_98 = dVar18;
            local_90 = dVar15;
            ON_3dPoint::operator=(&local_b8,pOVar5 + *piVar11);
            if (local_48 <= local_b8.x) {
              if (local_40 < local_b8.x) {
                local_68 = local_b8.x;
              }
            }
            else {
              local_88 = local_b8.x;
            }
            pdVar8 = &local_80;
            if ((local_b8.y < local_50) || (pdVar8 = &local_60, local_a0 < local_b8.y)) {
              *pdVar8 = local_b8.y;
            }
            pdVar8 = local_78;
            if ((local_b8.z < local_98) || (pdVar8 = &local_58, local_90 < local_b8.z)) {
              *pdVar8 = local_b8.z;
            }
          }
          bVar6 = Insert(this,&local_88,&local_68,(int)uVar12);
          if (!bVar6) {
            this->m_root = (ON_RTreeNode *)0x0;
            pBVar10 = (this->m_mem_pool).m_blk_list;
            if (pBVar10 != (Blk *)0x0) {
              (this->m_mem_pool).m_blk_list = (Blk *)0x0;
              (this->m_mem_pool).m_sizeof_blk = 0;
              (this->m_mem_pool).m_buffer = (uchar *)0x0;
              (this->m_mem_pool).m_buffer_capacity = 0;
              (this->m_mem_pool).m_nodes = (Blk *)0x0;
              (this->m_mem_pool).m_list_nodes = (Blk *)0x0;
              (this->m_mem_pool).m_sizeof_heap = 0;
              do {
                pBVar3 = pBVar10->m_next;
                onfree(pBVar10);
                pBVar10 = pBVar3;
              } while (pBVar3 != (Blk *)0x0);
              return false;
            }
            goto LAB_005af582;
          }
          uVar12 = uVar12 + 1;
          piVar11 = piVar11 + 4;
        } while (local_38 != uVar12);
      }
      else {
        do {
          ON_3dPoint::operator=(&local_b8,pOVar5 + ((ON_MeshFace *)(piVar11 + -3))->vi[0]);
          local_98._0_4_ = SUB84(local_b8.y,0);
          local_98._4_4_ = (undefined4)((ulong)local_b8.y >> 0x20);
          local_68 = local_b8.x;
          local_88 = local_b8.x;
          local_60 = local_b8.y;
          local_80 = local_b8.y;
          local_58 = local_b8.z;
          local_78[0] = local_b8.z;
          dVar17 = pOVar9[((ON_MeshFace *)(piVar11 + -3))->vi[0]].x;
          dVar18 = pOVar9[((ON_MeshFace *)(piVar11 + -3))->vi[0]].y;
          dVar16 = pOVar9[((ON_MeshFace *)(piVar11 + -3))->vi[0]].z;
          dVar15 = dVar17;
          if ((local_b8.x <= dVar17) && (dVar15 = local_88, local_b8.x < dVar17)) {
            local_68 = dVar17;
          }
          local_88 = dVar15;
          local_40 = local_68;
          if (local_b8.y <= dVar18) {
            pdVar8 = &local_60;
            dVar15 = dVar18;
            local_48._0_4_ = (undefined4)local_98;
            local_48._4_4_ = local_98._4_4_;
            if (local_b8.y < dVar18) goto LAB_005ae9ec;
          }
          else {
            pdVar8 = &local_80;
            local_98._0_4_ = SUB84(dVar18,0);
            local_98._4_4_ = (undefined4)((ulong)dVar18 >> 0x20);
            dVar15 = local_b8.y;
LAB_005ae9ec:
            *pdVar8 = dVar18;
            local_48._0_4_ = SUB84(dVar15,0);
            local_48._4_4_ = (int)((ulong)dVar15 >> 0x20);
          }
          local_50 = local_88;
          if (local_b8.z <= dVar16) {
            pdVar8 = &local_58;
            local_a0 = local_b8.z;
            dVar15 = dVar16;
            if (local_b8.z < dVar16) goto LAB_005aea3e;
          }
          else {
            pdVar8 = local_78;
            dVar15 = local_b8.z;
            local_a0 = dVar16;
LAB_005aea3e:
            *pdVar8 = dVar16;
            local_b8.z = dVar15;
          }
          local_b8.x = dVar17;
          local_b8.y = dVar18;
          local_90 = local_b8.z;
          local_b8.z = dVar16;
          ON_3dPoint::operator=(&local_b8,pOVar5 + piVar11[-2]);
          if (local_50 <= local_b8.x) {
            dVar16 = local_50;
            if (local_40 < local_b8.x) {
              local_68 = local_b8.x;
              local_40 = local_b8.x;
            }
          }
          else {
            local_88 = local_b8.x;
            dVar16 = local_b8.x;
          }
          if ((double)CONCAT44(local_98._4_4_,(undefined4)local_98) < local_b8.y ||
              (double)CONCAT44(local_98._4_4_,(undefined4)local_98) == local_b8.y) {
            pdVar8 = &local_60;
            dVar17 = local_b8.y;
            if ((double)CONCAT44(local_48._4_4_,(undefined4)local_48) <= local_b8.y &&
                local_b8.y != (double)CONCAT44(local_48._4_4_,(undefined4)local_48))
            goto LAB_005aeaed;
          }
          else {
            pdVar8 = &local_80;
            local_98._0_4_ = SUB84(local_b8.y,0);
            local_98._4_4_ = (undefined4)((ulong)local_b8.y >> 0x20);
            dVar17 = (double)CONCAT44(local_48._4_4_,(undefined4)local_48);
LAB_005aeaed:
            *pdVar8 = local_b8.y;
            local_48._0_4_ = SUB84(dVar17,0);
            local_48._4_4_ = (int)((ulong)dVar17 >> 0x20);
          }
          if (local_a0 <= local_b8.z) {
            pdVar8 = &local_58;
            dVar17 = local_b8.z;
            if (local_90 < local_b8.z) goto LAB_005aeb1f;
          }
          else {
            pdVar8 = local_78;
            dVar17 = local_90;
            local_a0 = local_b8.z;
LAB_005aeb1f:
            *pdVar8 = local_b8.z;
            local_90 = dVar17;
          }
          local_b8.x = pOVar9[piVar11[-2]].x;
          local_b8.y = pOVar9[piVar11[-2]].y;
          local_b8.z = pOVar9[piVar11[-2]].z;
          dVar17 = local_b8.x;
          dVar18 = local_b8.x;
          if ((dVar16 <= local_b8.x) && (dVar17 = dVar16, dVar18 = local_88, local_40 < local_b8.x))
          {
            local_40 = local_b8.x;
            local_68 = local_b8.x;
          }
          local_88 = dVar18;
          if ((double)CONCAT44(local_98._4_4_,(undefined4)local_98) < local_b8.y ||
              (double)CONCAT44(local_98._4_4_,(undefined4)local_98) == local_b8.y) {
            pdVar8 = &local_60;
            dVar16 = local_b8.y;
            if ((double)CONCAT44(local_48._4_4_,(undefined4)local_48) <= local_b8.y &&
                local_b8.y != (double)CONCAT44(local_48._4_4_,(undefined4)local_48))
            goto LAB_005aeb93;
          }
          else {
            pdVar8 = &local_80;
            local_98._0_4_ = SUB84(local_b8.y,0);
            local_98._4_4_ = (undefined4)((ulong)local_b8.y >> 0x20);
            dVar16 = (double)CONCAT44(local_48._4_4_,(undefined4)local_48);
LAB_005aeb93:
            *pdVar8 = local_b8.y;
            local_48._0_4_ = SUB84(dVar16,0);
            local_48._4_4_ = (undefined4)((ulong)dVar16 >> 0x20);
          }
          local_50 = dVar17;
          if (local_a0 <= local_b8.z) {
            pdVar8 = &local_58;
            dVar16 = local_b8.z;
            if (local_90 < local_b8.z) goto LAB_005aebe5;
          }
          else {
            pdVar8 = local_78;
            dVar16 = local_90;
            local_a0 = local_b8.z;
LAB_005aebe5:
            *pdVar8 = local_b8.z;
            local_90 = dVar16;
          }
          ON_3dPoint::operator=(&local_b8,pOVar5 + piVar11[-1]);
          uVar13 = (undefined4)((ulong)local_98 >> 0x20);
          uVar14 = (undefined4)((ulong)local_48 >> 0x20);
          dVar16 = local_40;
          if (local_50 <= local_b8.x) {
            dVar17 = local_50;
            if (local_40 < local_b8.x) {
              local_68 = local_b8.x;
              dVar16 = local_b8.x;
            }
          }
          else {
            local_88 = local_b8.x;
            dVar17 = local_b8.x;
          }
          uVar21 = SUB84(local_48,0);
          uVar19 = SUB84(local_98,0);
          if (local_98 <= local_b8.y) {
            pdVar8 = &local_60;
            dVar18 = local_b8.y;
            if (local_48 < local_b8.y) goto LAB_005aec94;
          }
          else {
            pdVar8 = &local_80;
            uVar19 = SUB84(local_b8.y,0);
            uVar13 = (undefined4)((ulong)local_b8.y >> 0x20);
            dVar18 = local_48;
LAB_005aec94:
            *pdVar8 = local_b8.y;
            uVar21 = SUB84(dVar18,0);
            uVar14 = (undefined4)((ulong)dVar18 >> 0x20);
          }
          if (local_a0 <= local_b8.z) {
            pdVar8 = &local_58;
            dVar18 = local_b8.z;
            dVar15 = local_a0;
            dVar24 = local_90;
            if (local_90 < local_b8.z) goto LAB_005aecc6;
          }
          else {
            pdVar8 = local_78;
            dVar18 = local_90;
            dVar15 = local_b8.z;
LAB_005aecc6:
            *pdVar8 = local_b8.z;
            dVar24 = dVar18;
          }
          local_b8.x = pOVar9[piVar11[-1]].x;
          local_b8.y = pOVar9[piVar11[-1]].y;
          local_b8.z = pOVar9[piVar11[-1]].z;
          dVar18 = local_b8.x;
          dVar23 = local_b8.x;
          if ((dVar17 <= local_b8.x) && (dVar18 = dVar17, dVar23 = local_88, dVar16 < local_b8.x)) {
            dVar16 = local_b8.x;
            local_68 = local_b8.x;
          }
          local_88 = dVar23;
          if ((double)CONCAT44(uVar13,uVar19) < local_b8.y ||
              (double)CONCAT44(uVar13,uVar19) == local_b8.y) {
            pdVar8 = &local_60;
            dVar17 = local_b8.y;
            if ((double)CONCAT44(uVar14,uVar21) <= local_b8.y &&
                local_b8.y != (double)CONCAT44(uVar14,uVar21)) goto LAB_005aed3a;
          }
          else {
            pdVar8 = &local_80;
            uVar19 = SUB84(local_b8.y,0);
            uVar13 = (undefined4)((ulong)local_b8.y >> 0x20);
            dVar17 = (double)CONCAT44(uVar14,uVar21);
LAB_005aed3a:
            *pdVar8 = local_b8.y;
            uVar21 = SUB84(dVar17,0);
            uVar14 = (undefined4)((ulong)dVar17 >> 0x20);
          }
          if (dVar15 <= local_b8.z) {
            pdVar8 = &local_58;
            dVar17 = local_b8.z;
            if (dVar24 < local_b8.z) goto LAB_005aed6c;
          }
          else {
            pdVar8 = local_78;
            dVar17 = dVar24;
            dVar15 = local_b8.z;
LAB_005aed6c:
            *pdVar8 = local_b8.z;
            dVar24 = dVar17;
          }
          if (piVar11[-1] != *piVar11) {
            local_48 = (double)CONCAT44(uVar14,uVar21);
            local_98 = (double)CONCAT44(uVar13,uVar19);
            local_a0 = dVar15;
            local_90 = dVar24;
            local_50 = dVar18;
            local_40 = dVar16;
            ON_3dPoint::operator=(&local_b8,pOVar5 + *piVar11);
            uVar13 = (undefined4)((ulong)local_98 >> 0x20);
            uVar14 = (undefined4)((ulong)local_48 >> 0x20);
            dVar16 = local_40;
            if (local_50 <= local_b8.x) {
              dVar17 = local_50;
              if (local_40 < local_b8.x) {
                local_68 = local_b8.x;
                dVar16 = local_b8.x;
              }
            }
            else {
              local_88 = local_b8.x;
              dVar17 = local_b8.x;
            }
            uVar21 = SUB84(local_48,0);
            uVar19 = SUB84(local_98,0);
            if (local_98 <= local_b8.y) {
              pdVar8 = &local_60;
              dVar18 = local_b8.y;
              if (local_48 < local_b8.y) goto LAB_005aee43;
            }
            else {
              pdVar8 = &local_80;
              uVar19 = SUB84(local_b8.y,0);
              uVar13 = (undefined4)((ulong)local_b8.y >> 0x20);
              dVar18 = local_48;
LAB_005aee43:
              *pdVar8 = local_b8.y;
              uVar21 = SUB84(dVar18,0);
              uVar14 = (undefined4)((ulong)dVar18 >> 0x20);
            }
            if (local_a0 <= local_b8.z) {
              pdVar8 = &local_58;
              dVar18 = local_b8.z;
              dVar15 = local_a0;
              dVar24 = local_90;
              if (local_90 < local_b8.z) goto LAB_005aee75;
            }
            else {
              pdVar8 = local_78;
              dVar18 = local_90;
              dVar15 = local_b8.z;
LAB_005aee75:
              *pdVar8 = local_b8.z;
              dVar24 = dVar18;
            }
            local_b8.x = pOVar9[*piVar11].x;
            local_b8.y = pOVar9[*piVar11].y;
            local_b8.z = pOVar9[*piVar11].z;
            dVar18 = local_b8.x;
            if ((dVar17 <= local_b8.x) && (dVar18 = local_88, dVar16 < local_b8.x)) {
              local_68 = local_b8.x;
            }
            local_88 = dVar18;
            pdVar8 = &local_80;
            if ((local_b8.y <= (double)CONCAT44(uVar13,uVar19) &&
                 (double)CONCAT44(uVar13,uVar19) != local_b8.y) ||
               (pdVar8 = &local_60,
               (double)CONCAT44(uVar14,uVar21) <= local_b8.y &&
               local_b8.y != (double)CONCAT44(uVar14,uVar21))) {
              *pdVar8 = local_b8.y;
            }
            pdVar8 = local_78;
            if ((local_b8.z < dVar15) || (pdVar8 = &local_58, dVar24 < local_b8.z)) {
              *pdVar8 = local_b8.z;
            }
          }
          bVar6 = Insert(this,&local_88,&local_68,(int)uVar12);
          if (!bVar6) {
            this->m_root = (ON_RTreeNode *)0x0;
            pBVar10 = (this->m_mem_pool).m_blk_list;
            if (pBVar10 != (Blk *)0x0) {
              (this->m_mem_pool).m_blk_list = (Blk *)0x0;
              (this->m_mem_pool).m_sizeof_blk = 0;
              (this->m_mem_pool).m_buffer = (uchar *)0x0;
              (this->m_mem_pool).m_buffer_capacity = 0;
              (this->m_mem_pool).m_nodes = (Blk *)0x0;
              (this->m_mem_pool).m_list_nodes = (Blk *)0x0;
              (this->m_mem_pool).m_sizeof_heap = 0;
              do {
                pBVar3 = pBVar10->m_next;
                onfree(pBVar10);
                pBVar10 = pBVar3;
              } while (pBVar3 != (Blk *)0x0);
              return false;
            }
            goto LAB_005af582;
          }
          uVar12 = uVar12 + 1;
          piVar11 = piVar11 + 4;
        } while (local_38 != uVar12);
      }
    }
    bVar6 = this->m_root != (ON_RTreeNode *)0x0;
  }
  return bVar6;
}

Assistant:

bool ON_RTree::CreateMeshFaceTree( const ON_Mesh* mesh )
{
  double fmin[3], fmax[3];
  ON_3dPoint V;
  unsigned int fi, fcount;
  const int* fvi;
  const ON_MeshFace* meshF;
  const ON_3fPoint* meshfV;
  const ON_3dPoint* meshdV;

  RemoveAll();

  if ( 0 == mesh )
    return false;

  fcount = mesh->m_F.UnsignedCount();
  if ( fcount <= 0 )
    return false;

  meshF = mesh->m_F.Array();
  if ( 0 == meshF )
    return false;

  meshfV = mesh->m_V.Array();

  meshdV = mesh->HasDoublePrecisionVertices() 
         ? mesh->DoublePrecisionVertices().Array() 
         : 0;

  if ( 0 != meshfV )
  {
    if ( 0 != meshdV )
    {
      for ( fi = 0; fi < fcount; fi++ )
      {
        fvi = meshF[fi].vi;

        V = meshfV[fvi[0]];
        fmin[0] = fmax[0] = V.x;
        fmin[1] = fmax[1] = V.y;
        fmin[2] = fmax[2] = V.z;
        V = meshdV[fvi[0]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        V = meshdV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        V = meshdV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        if ( fvi[2] != fvi[3] )
        {
          V = meshfV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
          V = meshdV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        }

        if ( !Insert(fmin,fmax,fi) )
        {
          RemoveAll();
          return false;
        }
      }
    }
    else
    {
      for ( fi = 0; fi < fcount; fi++ )
      {
        fvi = meshF[fi].vi;

        V = meshfV[fvi[0]];
        fmin[0] = fmax[0] = V.x;
        fmin[1] = fmax[1] = V.y;
        fmin[2] = fmax[2] = V.z;

        V = meshfV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        if ( fvi[2] != fvi[3] )
        {
          V = meshfV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
        }

        if ( !Insert(fmin,fmax,fi) )
        {
          RemoveAll();
          return false;
        }
      }
    }
  }
  else if ( 0 != meshdV )
  {
    for ( fi = 0; fi < fcount; fi++ )
    {
      fvi = meshF[fi].vi;

      V = meshdV[fvi[0]];
      fmin[0] = fmax[0] = V.x;
      fmin[1] = fmax[1] = V.y;
      fmin[2] = fmax[2] = V.z;

      V = meshdV[fvi[1]];
      if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
      if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
      if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

      V = meshdV[fvi[2]];
      if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
      if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
      if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

      if ( fvi[2] != fvi[3] )
      {
        V = meshdV[fvi[3]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
      }

      if ( !Insert(fmin,fmax,fi) )
      {
        RemoveAll();
        return false;
      }
    }
  }
  else
  {
    // no vertices
    return false;
  }

  return (0 != m_root);
}